

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

JavascriptArray *
Js::JavascriptOperators::GetOwnEnumerablePropertyNames
          (RecyclableObject *object,ScriptContext *scriptContext)

{
  code *pcVar1;
  uint32 itemIndex;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  JavascriptProxy *this;
  JavascriptArray *pJVar6;
  undefined4 extraout_var;
  Var pvVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 local_98 [8];
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord;
  JavascriptArray *local_48;
  Type local_3c;
  RecyclableObject *local_38;
  
  local_38 = object;
  bVar3 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(object);
  if (bVar3) {
    this = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(local_38);
    if (this != (JavascriptProxy *)0x0) {
      uVar9 = 0;
      pJVar6 = JavascriptProxy::PropertyKeysTrap(this,GetOwnPropertyNamesKind,scriptContext);
      local_48 = JavascriptLibrary::CreateArray
                           ((scriptContext->super_ScriptContextBase).javascriptLibrary,0);
      local_3c = (pJVar6->super_ArrayObject).length;
      local_58 = (PropertyRecord *)0x0;
      if (local_3c != 0) {
        propertyDescriptor._40_8_ = __tls_get_addr(&PTR_01548f08);
        propertyRecord = (PropertyRecord *)0x0;
        do {
          iVar4 = (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(pJVar6,uVar9);
          pvVar7 = (Var)CONCAT44(extraout_var,iVar4);
          bVar3 = VarIs<Js::JavascriptSymbol>(pvVar7);
          if (bVar3) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            uVar2 = propertyDescriptor._40_8_;
            *(undefined4 *)propertyDescriptor._40_8_ = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x506,"(!VarIs<JavascriptSymbol>(element))",
                                        "!VarIs<JavascriptSymbol>(element)");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)uVar2 = 0;
          }
          PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98);
          JavascriptConversion::ToPropertyKey(pvVar7,scriptContext,&local_58,(PropertyString **)0x0)
          ;
          BVar5 = GetOwnPropertyDescriptor
                            (local_38,local_58->pid,scriptContext,(PropertyDescriptor *)local_98);
          if (BVar5 != 0) {
            bVar3 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_98);
            if (bVar3) {
              itemIndex = (uint32)propertyRecord;
              pvVar7 = CrossSite::MarshalVar(scriptContext,pvVar7,false);
              JavascriptArray::DirectSetItemAt<void*>(local_48,itemIndex,pvVar7);
              propertyRecord = (PropertyRecord *)(ulong)(itemIndex + 1);
            }
          }
          uVar8 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar8;
        } while (local_3c != uVar8);
      }
      return local_48;
    }
  }
  pJVar6 = JavascriptObject::CreateOwnEnumerableStringPropertiesHelper(local_38,scriptContext);
  return pJVar6;
}

Assistant:

JavascriptArray* JavascriptOperators::GetOwnEnumerablePropertyNames(RecyclableObject* object, ScriptContext* scriptContext)
    {
        JavascriptProxy* proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(object);
        if (proxy)
        {
            JavascriptArray* proxyResult = proxy->PropertyKeysTrap(JavascriptProxy::KeysTrapKind::GetOwnPropertyNamesKind, scriptContext);
            JavascriptArray* proxyResultToReturn = scriptContext->GetLibrary()->CreateArray(0);

            // filter enumerable keys
            uint32 resultLength = proxyResult->GetLength();
            Var element;
            const Js::PropertyRecord *propertyRecord = nullptr;
            uint32 index = 0;
            for (uint32 i = 0; i < resultLength; i++)
            {
                element = proxyResult->DirectGetItem(i);

                Assert(!VarIs<JavascriptSymbol>(element));

                PropertyDescriptor propertyDescriptor;
                JavascriptConversion::ToPropertyKey(element, scriptContext, &propertyRecord, nullptr);
                if (JavascriptOperators::GetOwnPropertyDescriptor(object, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
                {
                    if (propertyDescriptor.IsEnumerable())
                    {
                        proxyResultToReturn->DirectSetItemAt(index++, CrossSite::MarshalVar(scriptContext, element));
                    }
                }
            }
            return proxyResultToReturn;
        }

        return JavascriptObject::CreateOwnEnumerableStringPropertiesHelper(object, scriptContext);
    }